

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityHistogram.cpp
# Opt level: O2

void __thiscall OpenMD::DensityHistogram::process(DensityHistogram *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  StuntDouble *pSVar4;
  long lVar5;
  pointer pdVar6;
  long lVar7;
  int iVar8;
  int istep;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  RealType min;
  vector<double,_std::allocator<double>_> density;
  int ii;
  DumpReader reader;
  double local_12d0;
  _Vector_base<double,_std::allocator<double>_> local_12c8;
  double local_12a8;
  double local_12a0;
  double local_1298;
  int local_128c;
  DumpReader local_1288;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_1288,&this->evaluator_);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_1288);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1288);
  }
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar3 = DumpReader::getNFrames(&local_1288);
  local_12a8 = (double)CONCAT44(local_12a8._4_4_,iVar3);
  local_12c8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_12c8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_12c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nProcessed_ = iVar3 / (this->super_StaticAnalyser).step_;
  for (iVar3 = 0; iVar3 < local_12a8._0_4_; iVar3 = iVar3 + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&local_1288,iVar3);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    pSVar4 = SelectionManager::beginSelected(&this->seleMan_,&local_128c);
    while (pSVar4 != (StuntDouble *)0x0) {
      dVar11 = *(double *)
                (*(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).density.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + pSVar4->storage_) +
                (long)pSVar4->localIndex_ * 8);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        local_12d0 = dVar11;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_12c8,&local_12d0);
      }
      pSVar4 = SelectionManager::nextSelected(&this->seleMan_,&local_128c);
    }
  }
  if (local_12c8._M_impl.super__Vector_impl_data._M_start ==
      local_12c8._M_impl.super__Vector_impl_data._M_finish) {
    builtin_strncpy(painCave.errMsg,"Density for selected atom not found.\n",0x26);
    painCave.isFatal = 1;
    simError();
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_12c8._M_impl.super__Vector_impl_data._M_start,
             local_12c8._M_impl.super__Vector_impl_data._M_finish);
  local_12d0 = *local_12c8._M_impl.super__Vector_impl_data._M_start;
  iVar3 = this->nBins_;
  dVar11 = (local_12c8._M_impl.super__Vector_impl_data._M_finish[-1] - local_12d0) / (double)iVar3;
  this->averageDensity_ = 0.0;
  this_00 = &this->bincenter_;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_12a8 = local_12d0;
    local_1298 = dVar11;
    for (iVar8 = 0; iVar8 < iVar3 + 3; iVar8 = iVar8 + 1) {
      local_12a0 = (double)(iVar8 + -1) * local_1298 + local_12a8;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_12a0);
      local_12a0 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&this->histList_,&local_12a0);
      iVar3 = this->nBins_;
    }
    lVar5 = (long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 3;
    auVar10._8_4_ =
         (int)((long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar10._0_8_ = lVar5;
    auVar10._12_4_ = 0x45300000;
    lVar7 = 0;
    for (pdVar6 = local_12c8._M_impl.super__Vector_impl_data._M_start; lVar7 = (long)(int)lVar7,
        pdVar6 < local_12c8._M_impl.super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
      pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        dVar11 = pdVar1[lVar7];
        if ((dVar11 <= *pdVar6) && (*pdVar6 < pdVar1[lVar7 + 1])) break;
        this->averageDensity_ = dVar11 * pdVar2[lVar7] + this->averageDensity_;
        lVar7 = lVar7 + 1;
      }
      pdVar2[lVar7] =
           pdVar2[lVar7] +
           1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    }
    dVar11 = (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7] *
             (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7] + this->averageDensity_;
  }
  else {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_12d0);
    lVar5 = (long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 3;
    auVar9._8_4_ = (int)((long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    local_12a0 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->histList_,&local_12a0)
    ;
    dVar11 = local_12d0;
  }
  this->averageDensity_ = dVar11;
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_12c8);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void DensityHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> density;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        if (sd->getDensity()) density.push_back(sd->getDensity());
      }
    }

    if (density.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Density for selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(density.begin(), density.end());

    RealType min = density.front();
    RealType max = density.back();

    RealType delta_density = (max - min) / (nBins_);
    averageDensity_        = 0;
    if (delta_density == 0) {
      bincenter_.push_back(min);
      histList_.push_back(density.size());
      averageDensity_ = min;
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_density);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType density_length = static_cast<RealType>(density.size());

      bool hist_update;
      for (index = density.begin(); index < density.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / density_length;
            hist_update = false;
          } else {
            averageDensity_ +=
                histList_[bin_center_pos] * bincenter_[bin_center_pos];
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
      averageDensity_ += histList_[bin_center_pos] * bincenter_[bin_center_pos];
    }
    writeDensity();
  }